

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x947480;
  *(undefined8 *)&this->field_0x30 = 0x947598;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9474a8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9474d0;
  *(undefined8 *)&this[-1].field_0x118 = 0x9474f8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x947520;
  *(undefined8 *)&this[-1].field_0x180 = 0x947548;
  *(undefined8 *)this = 0x947570;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__009475b8);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}